

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  bool bVar1;
  char *pcVar2;
  Fault local_18;
  Fault f;
  Input *this_local;
  
  f.exception = (Exception *)this;
  bVar1 = exhausted(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x21a,FAILED,"!exhausted()","\"JSON message ends prematurely.\"",
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal(&local_18);
  }
  pcVar2 = kj::ArrayPtr<const_char>::front(&this->wrapped);
  return *pcVar2;
}

Assistant:

char nextChar() {
    KJ_REQUIRE(!exhausted(), "JSON message ends prematurely.");
    return wrapped.front();
  }